

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_io.c
# Opt level: O0

int CVodeSetConstraints(void *cvode_mem,N_Vector constraints)

{
  N_Vector p_Var1;
  long in_RSI;
  CVodeMem in_RDI;
  N_Vector x;
  realtype temptest;
  CVodeMem cv_mem;
  int local_4;
  
  if (in_RDI == (CVodeMem)0x0) {
    cvProcessError((CVodeMem)0x0,-0x15,"CVODE","CVodeSetConstraints","cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (in_RSI == 0) {
    if (in_RDI->cv_constraintsMallocDone != 0) {
      N_VDestroy((N_Vector)0xef897d);
      in_RDI->cv_lrw = in_RDI->cv_lrw - (long)in_RDI->cv_lrw1;
      in_RDI->cv_liw = in_RDI->cv_liw - (long)in_RDI->cv_liw1;
    }
    in_RDI->cv_constraintsMallocDone = 0;
    in_RDI->cv_constraintsSet = 0;
    local_4 = 0;
  }
  else if ((((*(long *)(*(long *)(in_RSI + 8) + 0x68) == 0) ||
            (*(long *)(*(long *)(in_RSI + 8) + 0x98) == 0)) ||
           (*(long *)(*(long *)(in_RSI + 8) + 200) == 0)) ||
          ((*(long *)(*(long *)(in_RSI + 8) + 0xd8) == 0 ||
           (*(long *)(*(long *)(in_RSI + 8) + 0xe0) == 0)))) {
    cvProcessError(in_RDI,-0x16,"CVODE","CVodeSetConstraints",
                   "A required vector operation is not implemented.");
    local_4 = -0x16;
  }
  else {
    x = (N_Vector)N_VMaxNorm((N_Vector)in_RDI);
    if ((2.5 < (double)x) || ((double)x < 0.5)) {
      cvProcessError(in_RDI,-0x16,"CVODE","CVodeSetConstraints",
                     "Illegal values in constraints vector.");
      local_4 = -0x16;
    }
    else {
      if (in_RDI->cv_constraintsMallocDone == 0) {
        p_Var1 = N_VClone((N_Vector)in_RDI);
        in_RDI->cv_constraints = p_Var1;
        in_RDI->cv_lrw = (long)in_RDI->cv_lrw1 + in_RDI->cv_lrw;
        in_RDI->cv_liw = (long)in_RDI->cv_liw1 + in_RDI->cv_liw;
        in_RDI->cv_constraintsMallocDone = 1;
      }
      N_VScale((realtype)in_RDI,x,(N_Vector)0xef8b6e);
      in_RDI->cv_constraintsSet = 1;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int CVodeSetConstraints(void *cvode_mem, N_Vector constraints)
{
  CVodeMem cv_mem;
  realtype temptest;

  if (cvode_mem==NULL) {
    cvProcessError(NULL, CV_MEM_NULL, "CVODE", "CVodeSetConstraints", MSGCV_NO_MEM);
    return(CV_MEM_NULL);
  }

  cv_mem = (CVodeMem) cvode_mem;

  /* If there are no constraints, destroy data structures */
  if (constraints == NULL) {
    if (cv_mem->cv_constraintsMallocDone) {
      N_VDestroy(cv_mem->cv_constraints);
      cv_mem->cv_lrw -= cv_mem->cv_lrw1;
      cv_mem->cv_liw -= cv_mem->cv_liw1;
    }
    cv_mem->cv_constraintsMallocDone = SUNFALSE;
    cv_mem->cv_constraintsSet = SUNFALSE;
    return(CV_SUCCESS);
  }

  /* Test if required vector ops. are defined */

  if (constraints->ops->nvdiv         == NULL ||
      constraints->ops->nvmaxnorm     == NULL ||
      constraints->ops->nvcompare     == NULL ||
      constraints->ops->nvconstrmask  == NULL ||
      constraints->ops->nvminquotient == NULL) {
    cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVodeSetConstraints", MSGCV_BAD_NVECTOR);
    return(CV_ILL_INPUT);
  }

  /* Check the constraints vector */
  temptest = N_VMaxNorm(constraints);
  if ((temptest > TWOPT5) || (temptest < HALF)) {
    cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVodeSetConstraints", MSGCV_BAD_CONSTR);
    return(CV_ILL_INPUT);
  }

  if ( !(cv_mem->cv_constraintsMallocDone) ) {
    cv_mem->cv_constraints = N_VClone(constraints);
    cv_mem->cv_lrw += cv_mem->cv_lrw1;
    cv_mem->cv_liw += cv_mem->cv_liw1;
    cv_mem->cv_constraintsMallocDone = SUNTRUE;
  }

  /* Load the constraints vector */
  N_VScale(ONE, constraints, cv_mem->cv_constraints);

  cv_mem->cv_constraintsSet = SUNTRUE;

  return(CV_SUCCESS);
}